

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_24fa3d::OSSPlayback::mixerProc(OSSPlayback *this)

{
  ALCdevice *pAVar1;
  FILE *pFVar2;
  ALuint AVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t __n;
  pointer outBuffer;
  pollfd local_48;
  ulong local_40;
  ulong local_38;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  AVar3 = ALCdevice::channelsFromFmt((this->super_BackendBase).mDevice);
  local_38 = (ulong)AVar3;
  AVar3 = ALCdevice::frameSizeFromFmt((this->super_BackendBase).mDevice);
  local_40 = (ulong)AVar3;
LAB_0015d66b:
  do {
    while( true ) {
      while( true ) {
        if (((this->mKillNow)._M_base._M_i & 1U) != 0) {
          return 0;
        }
        if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
          return 0;
        }
        local_48.events = 4;
        local_48.revents = 0;
        local_48.fd = this->mFd;
        iVar4 = poll(&local_48,1,1000);
        if (-1 < iVar4) break;
        piVar6 = __errno_location();
        pFVar2 = gLogFile;
        iVar4 = *piVar6;
        if ((iVar4 != 4) && (iVar4 != 0xb)) {
          if (0 < (int)gLogLevel) {
            pcVar7 = strerror(iVar4);
            fprintf((FILE *)pFVar2,"[ALSOFT] (EE) poll failed: %s\n",pcVar7);
            iVar4 = *piVar6;
          }
          pAVar1 = (this->super_BackendBase).mDevice;
          pcVar7 = strerror(iVar4);
          ALCdevice::handleDisconnect(pAVar1,"Failed waiting for playback buffer: %s",pcVar7);
          return 0;
        }
      }
      if (iVar4 != 0) break;
      if (1 < (int)gLogLevel) {
        fwrite("[ALSOFT] (WW) poll timeout\n",0x1b,1,(FILE *)gLogFile);
      }
    }
    outBuffer = (this->mMixData).
                super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                super__Vector_impl_data._M_start;
    __n = (long)(this->mMixData).
                super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)outBuffer;
    ALCdevice::renderSamples
              ((this->super_BackendBase).mDevice,outBuffer,(ALuint)(__n / local_40),local_38);
    do {
      while( true ) {
        if ((__n == 0) || (((this->mKillNow)._M_base._M_i & 1U) != 0)) goto LAB_0015d66b;
        sVar5 = write(this->mFd,outBuffer,__n);
        if (sVar5 < 0) break;
        __n = __n - sVar5;
        outBuffer = outBuffer + sVar5;
      }
      piVar6 = __errno_location();
      pFVar2 = gLogFile;
      iVar4 = *piVar6;
    } while ((iVar4 == 4) || (iVar4 == 0xb));
    if (0 < (int)gLogLevel) {
      pcVar7 = strerror(iVar4);
      fprintf((FILE *)pFVar2,"[ALSOFT] (EE) write failed: %s\n",pcVar7);
      iVar4 = *piVar6;
    }
    pAVar1 = (this->super_BackendBase).mDevice;
    pcVar7 = strerror(iVar4);
    ALCdevice::handleDisconnect(pAVar1,"Failed writing playback samples: %s",pcVar7);
  } while( true );
}

Assistant:

int OSSPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t frame_step{mDevice->channelsFromFmt()};
    const ALuint frame_size{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLOUT;

        int pret{poll(&pollitem, 1, 1000)};
        if(pret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed waiting for playback buffer: %s", strerror(errno));
            break;
        }
        else if(pret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        ALubyte *write_ptr{mMixData.data()};
        size_t to_write{mMixData.size()};
        mDevice->renderSamples(write_ptr, static_cast<ALuint>(to_write/frame_size), frame_step);
        while(to_write > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            ssize_t wrote{write(mFd, write_ptr, to_write)};
            if(wrote < 0)
            {
                if(errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
                    continue;
                ERR("write failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed writing playback samples: %s", strerror(errno));
                break;
            }

            to_write -= static_cast<size_t>(wrote);
            write_ptr += wrote;
        }
    }

    return 0;
}